

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O3

void __thiscall
Importer_missingUnitsFromImportOfCnTerms_Test::TestBody
          (Importer_missingUnitsFromImportOfCnTerms_Test *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  long lVar1;
  char cVar2;
  char *pcVar3;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_;
  ComponentPtr c;
  ImporterPtr importer;
  ValidatorPtr validator;
  ImportSourcePtr imp;
  long *local_d0;
  AssertionResult local_c8;
  long local_b8 [3];
  AssertHelper local_a0 [8];
  long *local_98;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  long local_88 [2];
  shared_ptr *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_70;
  long local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  shared_ptr *local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  shared_ptr *local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  string *local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  libcellml::Validator::create();
  local_c8._0_8_ = local_b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"model_from_imports","");
  libcellml::Model::create((string *)&local_78);
  if ((long *)local_c8._0_8_ != local_b8) {
    operator_delete((void *)local_c8._0_8_,local_b8[0] + 1);
  }
  local_c8._0_8_ = local_b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"c","");
  libcellml::Component::create((string *)&local_60);
  if ((long *)local_c8._0_8_ != local_b8) {
    operator_delete((void *)local_c8._0_8_,local_b8[0] + 1);
  }
  libcellml::Importer::create(SUB81(&local_50,0));
  libcellml::ImportSource::create();
  local_c8._0_8_ = local_b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"units_in_cn.cellml","");
  libcellml::ImportSource::setUrl(local_30);
  if ((long *)local_c8._0_8_ != local_b8) {
    operator_delete((void *)local_c8._0_8_,local_b8[0] + 1);
  }
  lVar1 = local_60;
  local_c8._0_8_ = local_b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"myComponent","");
  libcellml::ImportedEntity::setImportReference((string *)(lVar1 + 0x10));
  if ((long *)local_c8._0_8_ != local_b8) {
    operator_delete((void *)local_c8._0_8_,local_b8[0] + 1);
  }
  libcellml::ImportedEntity::setImportSource((shared_ptr *)(local_60 + 0x10));
  libcellml::ComponentEntity::addComponent(local_78);
  cVar2 = libcellml::Model::hasUnresolvedImports();
  local_98 = (long *)CONCAT71(local_98._1_7_,cVar2);
  local_90.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (cVar2 == '\0') {
    testing::Message::Message((Message *)&local_d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_c8,(char *)&local_98,"model->hasUnresolvedImports()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/importer.cpp"
               ,0x87,(char *)local_c8._0_8_);
    testing::internal::AssertHelper::operator=(local_a0,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(local_a0);
    if ((long *)local_c8._0_8_ != local_b8) {
      operator_delete((void *)local_c8._0_8_,local_b8[0] + 1);
    }
    if (local_d0 != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_d0 != (long *)0x0)) {
        (**(code **)(*local_d0 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_90,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  pcVar3 = "";
  local_98 = local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"","");
  resourcePath((string *)&local_c8);
  libcellml::Importer::resolveImports(local_50,(string *)&local_78);
  if ((long *)local_c8._0_8_ != local_b8) {
    operator_delete((void *)local_c8._0_8_,local_b8[0] + 1);
  }
  if (local_98 != local_88) {
    operator_delete(local_98,local_88[0] + 1);
  }
  cVar2 = libcellml::Model::hasUnresolvedImports();
  local_98 = (long *)(CONCAT71(local_98._1_7_,cVar2) ^ 1);
  local_90.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (cVar2 != '\0') {
    testing::Message::Message((Message *)&local_d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_c8,(char *)&local_98,"model->hasUnresolvedImports()","true");
    testing::internal::AssertHelper::AssertHelper
              (local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/importer.cpp"
               ,0x8a,(char *)local_c8._0_8_);
    testing::internal::AssertHelper::operator=(local_a0,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(local_a0);
    if ((long *)local_c8._0_8_ != local_b8) {
      operator_delete((void *)local_c8._0_8_,local_b8[0] + 1);
    }
    if (local_d0 != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_d0 != (long *)0x0)) {
        (**(code **)(*local_d0 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_90,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  libcellml::Importer::flattenModel((shared_ptr *)&local_c8);
  this_00 = pbStack_70;
  pbStack_70 = local_c8.message_.ptr_;
  local_78 = (shared_ptr *)local_c8._0_8_;
  local_c8._0_8_ = (long *)0x0;
  local_c8.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (this_00 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
    if (local_c8.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8.message_.ptr_);
    }
  }
  libcellml::Validator::validateModel(local_40);
  local_98 = (long *)0x0;
  local_d0 = (long *)libcellml::Logger::errorCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_c8,"size_t(0)","validator->errorCount()",(unsigned_long *)&local_98,
             (unsigned_long *)&local_d0);
  if ((string)local_c8.success_ == (string)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (local_c8.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = ((local_c8.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/importer.cpp"
               ,0x8e,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_d0,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d0);
    if (local_98 != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_98 != (long *)0x0)) {
        (**(code **)(*local_98 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_c8.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
  }
  if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
  }
  if (pbStack_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pbStack_70);
  }
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  return;
}

Assistant:

TEST(Importer, missingUnitsFromImportOfCnTerms)
{
    // This test is intended to show that parsing a model and importing
    // it have the same end result.
    auto validator = libcellml::Validator::create();
    auto model = libcellml::Model::create("model_from_imports");
    auto c = libcellml::Component::create("c");
    auto importer = libcellml::Importer::create();

    auto imp = libcellml::ImportSource::create();
    imp->setUrl("units_in_cn.cellml");

    c->setImportReference("myComponent");
    c->setImportSource(imp);
    model->addComponent(c);

    EXPECT_TRUE(model->hasUnresolvedImports());

    importer->resolveImports(model, resourcePath());
    EXPECT_FALSE(model->hasUnresolvedImports());
    model = importer->flattenModel(model);

    validator->validateModel(model);
    EXPECT_EQ(size_t(0), validator->errorCount());
}